

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

PARTITION_TYPE get_partition(AV1_COMMON *cm,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  BLOCK_SIZE BVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  MB_MODE_INFO **ppMVar6;
  int split_idx;
  int horz_split;
  int vert_split;
  MB_MODE_INFO *mbmi_below;
  MB_MODE_INFO *mbmi_right;
  int sswide;
  int sshigh;
  int bwide;
  int bhigh;
  BLOCK_SIZE subsize;
  MB_MODE_INFO **mi;
  int offset;
  CommonModeInfoParams *mi_params;
  BLOCK_SIZE bsize_local;
  int mi_col_local;
  int mi_row_local;
  AV1_COMMON *cm_local;
  
  if ((mi_row < (cm->mi_params).mi_rows) && (mi_col < (cm->mi_params).mi_cols)) {
    ppMVar6 = (cm->mi_params).mi_grid_base + (mi_row * (cm->mi_params).mi_stride + mi_col);
    BVar1 = (*ppMVar6)->bsize;
    if (BVar1 == bsize) {
      cm_local._7_1_ = '\0';
    }
    else {
      uVar2 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [bsize];
      uVar3 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [bsize];
      uVar4 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [BVar1];
      uVar5 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [BVar1];
      if (((bsize < BLOCK_8X16) || ((cm->mi_params).mi_rows <= (int)(mi_row + uVar3 / 2))) ||
         ((cm->mi_params).mi_cols <= (int)(mi_col + uVar2 / 2))) {
        cm_local._7_1_ =
             get_partition::base_partitions
             [(int)((uint)(uVar5 < uVar3) << 1 | (uint)(uVar4 < uVar2))];
      }
      else if (uVar5 == uVar3) {
        if (uVar4 << 2 == uVar2) {
          cm_local._7_1_ = '\b';
        }
        else if (ppMVar6[(int)((uVar2 / 2) * (cm->mi_params).mi_stride)]->bsize == BVar1) {
          cm_local._7_1_ = '\x01';
        }
        else {
          cm_local._7_1_ = '\x05';
        }
      }
      else if (uVar4 == uVar2) {
        if (uVar5 << 2 == uVar3) {
          cm_local._7_1_ = '\t';
        }
        else if (ppMVar6[(int)(uVar3 / 2)]->bsize == BVar1) {
          cm_local._7_1_ = '\x02';
        }
        else {
          cm_local._7_1_ = '\a';
        }
      }
      else if ((uVar5 << 1 == uVar3) && (uVar4 << 1 == uVar2)) {
        if ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
            [ppMVar6[(int)((uVar2 / 2) * (cm->mi_params).mi_stride)]->bsize] == uVar3) {
          cm_local._7_1_ = '\x04';
        }
        else if ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [ppMVar6[(int)(uVar3 / 2)]->bsize] == uVar2) {
          cm_local._7_1_ = '\x06';
        }
        else {
          cm_local._7_1_ = '\x03';
        }
      }
      else {
        cm_local._7_1_ = '\x03';
      }
    }
  }
  else {
    cm_local._7_1_ = 0xff;
  }
  return cm_local._7_1_;
}

Assistant:

static inline PARTITION_TYPE get_partition(const AV1_COMMON *const cm,
                                           int mi_row, int mi_col,
                                           BLOCK_SIZE bsize) {
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  if (mi_row >= mi_params->mi_rows || mi_col >= mi_params->mi_cols)
    return PARTITION_INVALID;

  const int offset = mi_row * mi_params->mi_stride + mi_col;
  MB_MODE_INFO **mi = mi_params->mi_grid_base + offset;
  const BLOCK_SIZE subsize = mi[0]->bsize;

  assert(bsize < BLOCK_SIZES_ALL);

  if (subsize == bsize) return PARTITION_NONE;

  const int bhigh = mi_size_high[bsize];
  const int bwide = mi_size_wide[bsize];
  const int sshigh = mi_size_high[subsize];
  const int sswide = mi_size_wide[subsize];

  if (bsize > BLOCK_8X8 && mi_row + bwide / 2 < mi_params->mi_rows &&
      mi_col + bhigh / 2 < mi_params->mi_cols) {
    // In this case, the block might be using an extended partition
    // type.
    const MB_MODE_INFO *const mbmi_right = mi[bwide / 2];
    const MB_MODE_INFO *const mbmi_below = mi[bhigh / 2 * mi_params->mi_stride];

    if (sswide == bwide) {
      // Smaller height but same width. Is PARTITION_HORZ_4, PARTITION_HORZ or
      // PARTITION_HORZ_B. To distinguish the latter two, check if the lower
      // half was split.
      if (sshigh * 4 == bhigh) return PARTITION_HORZ_4;
      assert(sshigh * 2 == bhigh);

      if (mbmi_below->bsize == subsize)
        return PARTITION_HORZ;
      else
        return PARTITION_HORZ_B;
    } else if (sshigh == bhigh) {
      // Smaller width but same height. Is PARTITION_VERT_4, PARTITION_VERT or
      // PARTITION_VERT_B. To distinguish the latter two, check if the right
      // half was split.
      if (sswide * 4 == bwide) return PARTITION_VERT_4;
      assert(sswide * 2 == bwide);

      if (mbmi_right->bsize == subsize)
        return PARTITION_VERT;
      else
        return PARTITION_VERT_B;
    } else {
      // Smaller width and smaller height. Might be PARTITION_SPLIT or could be
      // PARTITION_HORZ_A or PARTITION_VERT_A. If subsize isn't halved in both
      // dimensions, we immediately know this is a split (which will recurse to
      // get to subsize). Otherwise look down and to the right. With
      // PARTITION_VERT_A, the right block will have height bhigh; with
      // PARTITION_HORZ_A, the lower block with have width bwide. Otherwise
      // it's PARTITION_SPLIT.
      if (sswide * 2 != bwide || sshigh * 2 != bhigh) return PARTITION_SPLIT;

      if (mi_size_wide[mbmi_below->bsize] == bwide) return PARTITION_HORZ_A;
      if (mi_size_high[mbmi_right->bsize] == bhigh) return PARTITION_VERT_A;

      return PARTITION_SPLIT;
    }
  }
  const int vert_split = sswide < bwide;
  const int horz_split = sshigh < bhigh;
  const int split_idx = (vert_split << 1) | horz_split;
  assert(split_idx != 0);

  static const PARTITION_TYPE base_partitions[4] = {
    PARTITION_INVALID, PARTITION_HORZ, PARTITION_VERT, PARTITION_SPLIT
  };

  return base_partitions[split_idx];
}